

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::TPZGeoBlend(TPZGeoBlend<pzgeom::TPZGeoCube> *this)

{
  long lVar1;
  
  *(undefined4 *)
   ((this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 6) = 0xffffffff
  ;
  *(undefined4 *)
   ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 0x34) =
       0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 7) = 0xffffffff
  ;
  *(undefined4 *)
   ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 0x3c) =
       0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 4) = 0xffffffff
  ;
  *(undefined4 *)
   ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 0x24) =
       0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 5) = 0xffffffff
  ;
  *(undefined4 *)
   ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 0x2c) =
       0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 2) = 0xffffffff
  ;
  *(undefined4 *)
   ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 0x14) =
       0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 3) = 0xffffffff
  ;
  *(undefined4 *)
   ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 0x1c) =
       0xffffffff;
  *(undefined4 *)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 4) =
       0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 1) = 0xffffffff
  ;
  *(undefined4 *)
   ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + 0xc) =
       0xffffffff;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_018b62d0;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e0);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0x230 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x2080);
  return;
}

Assistant:

TPZGeoBlend() : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                        TGeo() {
        }